

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O2

CharFieldSource * CharFieldSource::create(vm_val_t *val,vm_val_t *newval)

{
  ushort uVar1;
  int iVar2;
  CharFieldSourceByteArray *this;
  ushort *puVar3;
  CharFieldSource *pCVar4;
  
  newval->typ = VM_NIL;
  if ((val->typ == VM_OBJ) && (iVar2 = CVmObjByteArray::is_byte_array((val->val).obj), iVar2 != 0))
  {
    this = (CharFieldSourceByteArray *)operator_new(0x20);
    CharFieldSourceByteArray::CharFieldSourceByteArray(this,(val->val).obj);
    return &this->super_CharFieldSource;
  }
  puVar3 = (ushort *)vm_val_t::cast_to_string(val,newval);
  pCVar4 = (CharFieldSource *)operator_new(0x18);
  uVar1 = *puVar3;
  pCVar4->_vptr_CharFieldSource = (_func_int **)&PTR__CharFieldSource_00360ec0;
  pCVar4[1]._vptr_CharFieldSource = (_func_int **)(puVar3 + 1);
  pCVar4[2]._vptr_CharFieldSource = (_func_int **)(ulong)uVar1;
  return pCVar4;
}

Assistant:

CharFieldSource *CharFieldSource::create(
    VMG_ const vm_val_t *val, vm_val_t *newval)
{
    /* presume we won't create a new value */
    newval->set_nil();

    /* check to see if it's a ByteArray */
    if (val->typ == VM_OBJ
        && CVmObjByteArray::is_byte_array(vmg_ val->val.obj))
        return new CharFieldSourceByteArray(vmg_ val->val.obj);

    /* it's not another acceptable type, so it has to be a string */
    const char *str = val->cast_to_string(vmg_ newval);
    return new CharFieldSourceString(str + VMB_LEN, vmb_get_len(str));
}